

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O0

void __thiscall
ArgWrapper<wchar_t>::
ArgWrapper<wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*>
          (ArgWrapper<wchar_t> *this,wchar_t *in_args,wchar_t *in_args_1,wchar_t *in_args_2,
          wchar_t *in_args_3,wchar_t *in_args_4,wchar_t *in_args_5,wchar_t *in_args_6)

{
  initializer_list<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __l;
  wchar_t *pwVar1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_228;
  allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_164;
  undefined1 local_163;
  allocator<wchar_t> local_162;
  allocator<wchar_t> local_161;
  allocator<wchar_t> local_160;
  allocator<wchar_t> local_15f;
  allocator<wchar_t> local_15e;
  allocator<wchar_t> local_15d [20];
  allocator<wchar_t> local_149;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_148;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_140;
  wstring local_120 [32];
  wstring local_100 [32];
  wstring local_e0 [32];
  wstring local_c0 [32];
  wstring local_a0 [32];
  wstring local_80 [32];
  undefined1 local_60 [40];
  wchar_t *local_38;
  wchar_t *in_args_local_4;
  wchar_t *in_args_local_3;
  wchar_t *in_args_local_2;
  wchar_t *in_args_local_1;
  wchar_t *in_args_local;
  ArgWrapper<wchar_t> *this_local;
  
  local_163 = 1;
  local_148 = &local_140;
  local_38 = in_args_4;
  in_args_local_4 = in_args_3;
  in_args_local_3 = in_args_2;
  in_args_local_2 = in_args_1;
  in_args_local_1 = in_args;
  in_args_local = (wchar_t *)this;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_140,in_args,&local_149);
  pwVar1 = in_args_local_2;
  local_148 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
              local_120;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_120,pwVar1,local_15d);
  pwVar1 = in_args_local_3;
  local_148 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
              local_100;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_100,pwVar1,&local_15e);
  pwVar1 = in_args_local_4;
  local_148 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_e0
  ;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_e0,pwVar1,&local_15f);
  pwVar1 = local_38;
  local_148 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_c0
  ;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_c0,pwVar1,&local_160);
  local_148 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_a0
  ;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_a0,in_args_5,&local_161);
  local_148 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_80
  ;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_80,in_args_6,&local_162);
  local_163 = 0;
  local_60._0_8_ = &local_140;
  local_60._8_8_ = 7;
  std::
  allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::allocator(&local_164);
  __l._M_len = local_60._8_8_;
  __l._M_array = (iterator)local_60._0_8_;
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)(local_60 + 0x10),__l,&local_164);
  ArgWrapper(this,(vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)(local_60 + 0x10));
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)(local_60 + 0x10));
  std::
  allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::~allocator(&local_164);
  local_228 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_60
  ;
  do {
    local_228 = local_228 + -1;
    std::__cxx11::wstring::~wstring((wstring *)local_228);
  } while (local_228 != &local_140);
  std::allocator<wchar_t>::~allocator(&local_162);
  std::allocator<wchar_t>::~allocator(&local_161);
  std::allocator<wchar_t>::~allocator(&local_160);
  std::allocator<wchar_t>::~allocator(&local_15f);
  std::allocator<wchar_t>::~allocator(&local_15e);
  std::allocator<wchar_t>::~allocator(local_15d);
  std::allocator<wchar_t>::~allocator(&local_149);
  return;
}

Assistant:

ArgWrapper(Args... in_args)
		: ArgWrapper{ std::vector<std::basic_string<CharT>>{ in_args... } } {
		// Empty ctor body
	}